

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<std::__cxx11::u32string,char32_t_const*>
          (string *__return_storage_ptr__,internal *this,
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *value,
          char32_t **param_2)

{
  char32_t **param_1_local;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *value_local;
  
  PrintToString<std::__cxx11::u32string>(__return_storage_ptr__,(iutest *)this,value);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}